

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

return_type __thiscall
flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::
LookupByKey<unsigned_char>
          (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this,uchar key)

{
  uint *puVar1;
  return_type pEVar2;
  uint8_t *offset_location;
  uchar key_local;
  
  puVar1 = (uint *)bsearch(&key_local,this + 4,(ulong)*(uint *)this,4,KeyCompare<unsigned_char>);
  if (puVar1 == (uint *)0x0) {
    pEVar2 = (return_type)0x0;
  }
  else {
    pEVar2 = (return_type)((ulong)*puVar1 + (long)puVar1);
  }
  return pEVar2;
}

Assistant:

return_type LookupByKey(K key) const {
    void *search_result = std::bsearch(
        &key, Data(), size(), IndirectHelper<T>::element_stride, KeyCompare<K>);

    if (!search_result) {
      return nullptr;  // Key not found.
    }

    const uint8_t *element = reinterpret_cast<const uint8_t *>(search_result);

    return IndirectHelper<T>::Read(element, 0);
  }